

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::CurrentVertexAttribIntCase::test
          (CurrentVertexAttribIntCase *this)

{
  ostringstream *this_00;
  TestContext *testCtx;
  CallLogWrapper *this_01;
  bool bVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  int iVar6;
  undefined7 extraout_var;
  GLuint index;
  undefined1 auVar7 [16];
  int x;
  int y;
  int z;
  int w;
  int attribute_count;
  CallLogWrapper *local_218;
  CurrentVertexAttribIntCase *local_210;
  StateQueryMemoryWriteGuard<int[4]> attribValue;
  Random rnd;
  undefined1 local_1b0 [384];
  
  deRandom_init(&rnd.m_rnd,0xabcdef);
  attribute_count = 0x10;
  local_218 = &(this->super_ApiCase).super_CallLogWrapper;
  local_210 = this;
  glu::CallLogWrapper::glGetIntegerv(local_218,0x8869,&attribute_count);
  this_00 = (ostringstream *)(local_1b0 + 8);
  for (index = 0; (int)index < attribute_count; index = index + 1) {
    dVar2 = deRandom_getUint32(&rnd.m_rnd);
    dVar3 = deRandom_getUint32(&rnd.m_rnd);
    dVar4 = deRandom_getUint32(&rnd.m_rnd);
    dVar5 = deRandom_getUint32(&rnd.m_rnd);
    this_01 = local_218;
    x = dVar2 % 0x1f401 - 64000;
    y = dVar3 % 0x1f401 - 64000;
    z = dVar4 % 0x1f401 - 64000;
    w = dVar5 % 0x1f401 - 64000;
    glu::CallLogWrapper::glVertexAttribI4i(local_218,index,x,y,z,w);
    testCtx = (local_210->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::StateQueryMemoryWriteGuard
              (&attribValue);
    glu::CallLogWrapper::glGetVertexAttribIiv(this_01,index,0x8626,attribValue.m_value);
    bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::verifyValidity
                      (&attribValue,testCtx);
    auVar7._0_4_ = -(uint)(attribValue.m_value[0] == x);
    auVar7._4_4_ = -(uint)(attribValue.m_value[1] == y);
    auVar7._8_4_ = -(uint)(attribValue.m_value[2] == z);
    auVar7._12_4_ = -(uint)(attribValue.m_value[3] == w);
    iVar6 = movmskps((int)CONCAT71(extraout_var,bVar1),auVar7);
    if (iVar6 != 0xf) {
      local_1b0._0_8_ = testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"// ERROR: Expected [");
      std::ostream::operator<<(this_00,x);
      std::operator<<((ostream *)this_00,",");
      std::ostream::operator<<(this_00,y);
      std::operator<<((ostream *)this_00,",");
      std::ostream::operator<<(this_00,z);
      std::operator<<((ostream *)this_00,",");
      std::ostream::operator<<(this_00,w);
      std::operator<<((ostream *)this_00,"];");
      std::operator<<((ostream *)this_00,"got [");
      std::ostream::operator<<(this_00,attribValue.m_value[0]);
      std::operator<<((ostream *)this_00,",");
      std::ostream::operator<<(this_00,attribValue.m_value[1]);
      std::operator<<((ostream *)this_00,",");
      std::ostream::operator<<(this_00,attribValue.m_value[2]);
      std::operator<<((ostream *)this_00,",");
      std::ostream::operator<<(this_00,attribValue.m_value[3]);
      std::operator<<((ostream *)this_00,"]");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"got invalid attribute value");
      }
    }
  }
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		de::Random rnd(0xabcdef);

		int attribute_count = 16;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &attribute_count);

		// test write float/read float

		for (int index = 0; index < attribute_count; ++index)
		{
			const GLint x = rnd.getInt(-64000, 64000);
			const GLint y = rnd.getInt(-64000, 64000);
			const GLint z = rnd.getInt(-64000, 64000);
			const GLint w = rnd.getInt(-64000, 64000);

			glVertexAttribI4i(index, x, y, z, w);
			verifyCurrentVertexAttribIi(m_testCtx, *this, index, x, y, z, w);
		}
	}